

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::ActivationParams::ByteSizeLong(ActivationParams *this)

{
  long lVar1;
  uint32 uVar2;
  ActivationLinear *pAVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar2 = this->_oneof_case_[0];
  sVar5 = 0;
  if ((int)uVar2 < 0x1f) {
    sVar5 = 0;
    if ((int)uVar2 < 0x14) {
      if (uVar2 == 5) {
        pAVar3 = (this->NonlinearityType_).linear_;
        uVar8 = (ulong)(-(uint)(pAVar3->alpha_ != 0.0) & 1);
        lVar1 = uVar8 * 5 + 5;
        lVar6 = uVar8 * 5;
        if (pAVar3->beta_ != 0.0) {
          lVar6 = lVar1;
        }
        if (NAN(pAVar3->beta_)) {
          lVar6 = lVar1;
        }
        pAVar3->_cached_size_ = (int)lVar6;
        sVar5 = lVar6 + 2;
      }
      else if (uVar2 == 10) {
        ((this->NonlinearityType_).linear_)->alpha_ = 0.0;
        sVar5 = 2;
      }
      else if (uVar2 == 0xf) {
        uVar7 = -(uint)(((this->NonlinearityType_).leakyrelu_)->alpha_ != 0.0) & 1;
        ((this->NonlinearityType_).leakyrelu_)->_cached_size_ = uVar7 * 5;
        sVar5 = (ulong)uVar7 * 5 + 2;
      }
      goto LAB_001e727e;
    }
    if (uVar2 == 0x14) {
LAB_001e71f1:
      uVar7 = -(uint)(((this->NonlinearityType_).leakyrelu_)->alpha_ != 0.0) & 1;
      ((this->NonlinearityType_).leakyrelu_)->_cached_size_ = uVar7 * 5;
      sVar5 = (ulong)uVar7 * 5 + 3;
      goto LAB_001e727e;
    }
    if (uVar2 == 0x19) {
      sVar5 = ActivationPReLU::ByteSizeLong((this->NonlinearityType_).prelu_);
      goto LAB_001e7266;
    }
    if (uVar2 != 0x1e) goto LAB_001e727e;
  }
  else {
    if ((int)uVar2 < 0x32) {
      if (uVar2 != 0x1f) {
        if (uVar2 == 0x28) goto LAB_001e71dc;
        if (uVar2 != 0x29) goto LAB_001e727e;
      }
      pAVar3 = (this->NonlinearityType_).linear_;
      uVar8 = (ulong)(-(uint)(pAVar3->alpha_ != 0.0) & 1);
      lVar1 = uVar8 * 5 + 5;
      lVar6 = uVar8 * 5;
      if (pAVar3->beta_ != 0.0) {
        lVar6 = lVar1;
      }
      if (NAN(pAVar3->beta_)) {
        lVar6 = lVar1;
      }
      pAVar3->_cached_size_ = (int)lVar6;
      sVar5 = lVar6 + 3;
      goto LAB_001e727e;
    }
    if ((int)uVar2 < 0x46) {
      if (uVar2 == 0x32) goto LAB_001e71f1;
      if (uVar2 != 0x3c) goto LAB_001e727e;
    }
    else if (uVar2 != 0x46) {
      if (uVar2 != 0x47) goto LAB_001e727e;
      sVar5 = ActivationParametricSoftplus::ByteSizeLong
                        ((this->NonlinearityType_).parametricsoftplus_);
LAB_001e7266:
      uVar7 = (uint)sVar5 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar4 * 9 + 0x49U >> 6) + 2;
      goto LAB_001e727e;
    }
  }
LAB_001e71dc:
  ((this->NonlinearityType_).linear_)->alpha_ = 0.0;
  sVar5 = 3;
LAB_001e727e:
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t ActivationParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ActivationParams)
  size_t total_size = 0;

  switch (NonlinearityType_case()) {
    // .CoreML.Specification.ActivationLinear linear = 5;
    case kLinear: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.linear_);
      break;
    }
    // .CoreML.Specification.ActivationReLU ReLU = 10;
    case kReLU: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.relu_);
      break;
    }
    // .CoreML.Specification.ActivationLeakyReLU leakyReLU = 15;
    case kLeakyReLU: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.leakyrelu_);
      break;
    }
    // .CoreML.Specification.ActivationThresholdedReLU thresholdedReLU = 20;
    case kThresholdedReLU: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.thresholdedrelu_);
      break;
    }
    // .CoreML.Specification.ActivationPReLU PReLU = 25;
    case kPReLU: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.prelu_);
      break;
    }
    // .CoreML.Specification.ActivationTanh tanh = 30;
    case kTanh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.tanh_);
      break;
    }
    // .CoreML.Specification.ActivationScaledTanh scaledTanh = 31;
    case kScaledTanh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.scaledtanh_);
      break;
    }
    // .CoreML.Specification.ActivationSigmoid sigmoid = 40;
    case kSigmoid: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.sigmoid_);
      break;
    }
    // .CoreML.Specification.ActivationSigmoidHard sigmoidHard = 41;
    case kSigmoidHard: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.sigmoidhard_);
      break;
    }
    // .CoreML.Specification.ActivationELU ELU = 50;
    case kELU: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.elu_);
      break;
    }
    // .CoreML.Specification.ActivationSoftsign softsign = 60;
    case kSoftsign: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.softsign_);
      break;
    }
    // .CoreML.Specification.ActivationSoftplus softplus = 70;
    case kSoftplus: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.softplus_);
      break;
    }
    // .CoreML.Specification.ActivationParametricSoftplus parametricSoftplus = 71;
    case kParametricSoftplus: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *NonlinearityType_.parametricsoftplus_);
      break;
    }
    case NONLINEARITYTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}